

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

uint32_t cpu_ppc601_load_rtcu_ppc(CPUPPCState_conflict *env)

{
  uint32_t uVar1;
  CPUPPCState_conflict *env_local;
  
  uVar1 = _cpu_ppc_load_tbu(env);
  return uVar1;
}

Assistant:

uint32_t cpu_ppc601_load_rtcu (CPUPPCState *env)
{
    return _cpu_ppc_load_tbu(env);
}